

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.h
# Opt level: O2

void __thiscall
COLLADASaxFWL::DocumentProcessor::addInstanceJoint
          (DocumentProcessor *this,KinematicInstance *instanceJoint)

{
  KinematicInstance *local_8;
  
  local_8 = instanceJoint;
  std::
  vector<COLLADASaxFWL::KinematicInstance_*,_std::allocator<COLLADASaxFWL::KinematicInstance_*>_>::
  push_back(&this->mKinematicsIntermediateData->mInstanceJoints,&local_8);
  return;
}

Assistant:

void addInstanceJoint( KinematicInstance* instanceJoint ) { mKinematicsIntermediateData.getInstanceJoints().push_back(instanceJoint); }